

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O2

bool QMakeInternal::IoUtils::readLinkTarget(QString *symlinkPath,QString *target)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  ssize_t sVar4;
  char *__path;
  uint uVar5;
  long in_FS_OFFSET;
  char s [4097];
  QArrayDataPointer<char> local_1090;
  QArrayDataPointer<char16_t> local_1078;
  QArrayDataPointer<char> local_1058;
  char local_1038 [4112];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_1058.size = -0x5555555555555556;
  local_1058.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_1058.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QString::toLocal8Bit((QByteArray *)&local_1058,symlinkPath);
  memset(local_1038,0xaa,0x1001);
  __path = local_1058.ptr;
  if (local_1058.ptr == (char *)0x0) {
    __path = (char *)&QByteArray::_empty;
  }
  sVar4 = readlink(__path,local_1038,0x1000);
  uVar5 = (uint)sVar4;
  if (0 < (int)uVar5) {
    QByteArray::QByteArray((QByteArray *)&local_1090,local_1038,(ulong)(uVar5 & 0x7fffffff));
    QString::fromLocal8Bit<void>((QString *)&local_1078,(QByteArray *)&local_1090);
    pDVar2 = (target->d).d;
    pcVar3 = (target->d).ptr;
    (target->d).d = local_1078.d;
    (target->d).ptr = local_1078.ptr;
    qVar1 = (target->d).size;
    (target->d).size = local_1078.size;
    local_1078.d = pDVar2;
    local_1078.ptr = pcVar3;
    local_1078.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1078);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_1090);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_1058);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return 0 < (int)uVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool IoUtils::readLinkTarget(const QString &symlinkPath, QString *target)
{
    const QByteArray localSymlinkPath = QFile::encodeName(symlinkPath);
#  if defined(__GLIBC__) && !defined(PATH_MAX)
#    define PATH_CHUNK_SIZE 256
    char *s = 0;
    int len = -1;
    int size = PATH_CHUNK_SIZE;

    forever {
        s = (char *)::realloc(s, size);
        len = ::readlink(localSymlinkPath.constData(), s, size);
        if (len < 0) {
            ::free(s);
            break;
        }
        if (len < size)
            break;
        size *= 2;
    }
#  else
    char s[PATH_MAX+1];
    int len = readlink(localSymlinkPath.constData(), s, PATH_MAX);
#  endif
    if (len <= 0)
        return false;
    *target = QFile::decodeName(QByteArray(s, len));
#  if defined(__GLIBC__) && !defined(PATH_MAX)
    ::free(s);
#  endif
    return true;
}